

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  string *psVar6;
  uint minorVersion;
  uint majorVersion;
  string eclipseVersion;
  RegularExpression regex;
  string local_2b0;
  int local_290;
  int local_28c;
  long *local_288 [2];
  long local_278 [2];
  string *local_268;
  undefined1 local_260 [264];
  char *local_158;
  char *local_50;
  char *local_40;
  int local_38;
  
  puVar2 = (((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(cmMakefile **)
             ((long)(puVar2->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t + 0x70);
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"CMAKE_ECLIPSE_VERSION","");
  psVar6 = cmMakefile::GetSafeDefinition(this_00,(string *)local_260);
  local_288[0] = local_278;
  pcVar3 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,pcVar3,pcVar3 + psVar6->_M_string_length);
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
  }
  local_50 = (char *)0x0;
  local_40 = (char *)0x0;
  local_38 = 0;
  memset((RegularExpression *)local_260,0,0x20a);
  cmsys::RegularExpression::compile((RegularExpression *)local_260,".*([0-9]+\\.[0-9]+).*");
  bVar4 = cmsys::RegularExpression::find
                    ((RegularExpression *)local_260,(char *)local_288[0],
                     (RegularExpressionMatch *)local_260);
  if (bVar4) {
    local_28c = 0;
    local_290 = 0;
    if ((char *)local_260._8_8_ == (char *)0x0) {
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      local_2b0._M_string_length = 0;
      local_2b0.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,local_260._8_8_,local_158);
    }
    iVar5 = __isoc99_sscanf(local_2b0._M_dataplus._M_p,"%u.%u",&local_28c,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                               local_2b0.field_2._M_local_buf[0]) + 1);
    }
    if (iVar5 == 2) {
      iVar5 = local_28c * 1000 + local_290;
      if (iVar5 < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      else if (iVar5 != 0xbbe) goto LAB_004a3ee7;
      this->SupportsGmakeErrorParser = false;
    }
  }
LAB_004a3ee7:
  cmLocalGenerator::GetSourceDirectory_abi_cxx11_
            ((cmLocalGenerator *)
             (puVar2->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  std::__cxx11::string::_M_assign((string *)&this->HomeDirectory);
  cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
            ((cmLocalGenerator *)
             (puVar2->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  local_268 = &this->HomeOutputDirectory;
  std::__cxx11::string::_M_assign((string *)local_268);
  paVar1 = &local_2b0.field_2;
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES","");
  bVar4 = cmMakefile::IsOn(this_00,&local_2b0);
  this->GenerateLinkedResources = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]) + 1);
  }
  __n = (this->HomeDirectory)._M_string_length;
  if (__n == (this->HomeOutputDirectory)._M_string_length) {
    if (__n == 0) {
      this->IsOutOfSourceBuild = false;
    }
    else {
      iVar5 = bcmp((this->HomeDirectory)._M_dataplus._M_p,
                   (this->HomeOutputDirectory)._M_dataplus._M_p,__n);
      this->IsOutOfSourceBuild = iVar5 != 0;
      if (iVar5 != 0) goto LAB_004a3faa;
    }
    this->GenerateSourceProject = false;
  }
  else {
    this->IsOutOfSourceBuild = true;
LAB_004a3faa:
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT","");
    bVar4 = cmMakefile::IsOn(this_00,&local_2b0);
    this->GenerateSourceProject = bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar1) {
      if (bVar4) goto LAB_004a40ba;
    }
    else {
      operator_delete(local_2b0._M_dataplus._M_p,
                      CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                               local_2b0.field_2._M_local_buf[0]) + 1);
      if ((this->GenerateSourceProject & 1U) != 0) goto LAB_004a40ba;
    }
  }
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT","");
  bVar4 = cmMakefile::IsOn(this_00,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]) + 1);
  }
  if (bVar4) {
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,"");
    cmMakefile::IssueMessage(this_00,WARNING,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                               local_2b0.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_004a40ba:
  bVar4 = cmsys::SystemTools::IsSubDirectory(local_268,&this->HomeDirectory);
  if (bVar4) {
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,"");
    cmMakefile::IssueMessage(this_00,WARNING,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                               local_2b0.field_2._M_local_buf[0]) + 1);
    }
  }
  if (this->GenerateSourceProject == true) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  CreateSettingsResourcePrefsFile(this);
  if (local_40 != (char *)0x0) {
    operator_delete__(local_40);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion)) {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res =
      sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion, &minorVersion);
    if (res == 2) {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
      {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (version < 3007) // 3.7 is Indigo
      {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory = lg->GetSourceDirectory();
  this->HomeOutputDirectory = lg->GetBinaryDirectory();

  this->GenerateLinkedResources =
    mf->IsOn("CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild =
    (this->HomeDirectory != this->HomeOutputDirectory);

  this->GenerateSourceProject =
    (this->IsOutOfSourceBuild &&
     mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if (!this->GenerateSourceProject &&
      (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT"))) {
    mf->IssueMessage(
      MessageType::WARNING,
      "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
      "but this variable is not supported anymore since CMake 2.8.7.\n"
      "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
  }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory)) {
    mf->IssueMessage(MessageType::WARNING,
                     "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
  }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject) {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
  }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();

  // create resource settings
  this->CreateSettingsResourcePrefsFile();
}